

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::HasWKTWithObjCCategory(FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  size_type __rlen;
  size_t extraout_RDX;
  size_t __n;
  char *__s2;
  objectivec *__s1;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  objectivec aoStack_18 [16];
  
  __s1 = (objectivec *)(file->name_->_M_dataplus)._M_p;
  __n = file->name_->_M_string_length;
  if (__n == 0x1f) {
    __s2 = "google/protobuf/timestamp.proto";
    goto LAB_002ca186;
  }
  if (__n == 0x1e) goto LAB_002ca176;
  if ((__n == 0x19) &&
     (auVar4[0] = -(((char *)__s1)[9] == 'o'), auVar4[1] = -(((char *)__s1)[10] == 't'),
     auVar4[2] = -(((char *)__s1)[0xb] == 'o'), auVar4[3] = -(((char *)__s1)[0xc] == 'b'),
     auVar4[4] = -(((char *)__s1)[0xd] == 'u'), auVar4[5] = -(((char *)__s1)[0xe] == 'f'),
     auVar4[6] = -(((char *)__s1)[0xf] == '/'), auVar4[7] = -(((char *)__s1)[0x10] == 'a'),
     auVar4[8] = -(((char *)__s1)[0x11] == 'n'), auVar4[9] = -(((char *)__s1)[0x12] == 'y'),
     auVar4[10] = -(((char *)__s1)[0x13] == '.'), auVar4[0xb] = -(((char *)__s1)[0x14] == 'p'),
     auVar4[0xc] = -(((char *)__s1)[0x15] == 'r'), auVar4[0xd] = -(((char *)__s1)[0x16] == 'o'),
     auVar4[0xe] = -(((char *)__s1)[0x17] == 't'), auVar4[0xf] = -(((char *)__s1)[0x18] == 'o'),
     auVar3[0] = -(*(char *)__s1 == 'g'), auVar3[1] = -(((char *)__s1)[1] == 'o'),
     auVar3[2] = -(((char *)__s1)[2] == 'o'), auVar3[3] = -(((char *)__s1)[3] == 'g'),
     auVar3[4] = -(((char *)__s1)[4] == 'l'), auVar3[5] = -(((char *)__s1)[5] == 'e'),
     auVar3[6] = -(((char *)__s1)[6] == '/'), auVar3[7] = -(((char *)__s1)[7] == 'p'),
     auVar3[8] = -(((char *)__s1)[8] == 'r'), auVar3[9] = -(((char *)__s1)[9] == 'o'),
     auVar3[10] = -(((char *)__s1)[10] == 't'), auVar3[0xb] = -(((char *)__s1)[0xb] == 'o'),
     auVar3[0xc] = -(((char *)__s1)[0xc] == 'b'), auVar3[0xd] = -(((char *)__s1)[0xd] == 'u'),
     auVar3[0xe] = -(((char *)__s1)[0xe] == 'f'), auVar3[0xf] = -(((char *)__s1)[0xf] == '/'),
     auVar3 = auVar3 & auVar4,
     (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff)) {
    do {
      bVar1 = IsProtobufLibraryBundledProtoFile(file);
      if (bVar1) {
        return true;
      }
      __s1 = aoStack_18;
      HasWKTWithObjCCategory(aoStack_18);
      __n = extraout_RDX;
LAB_002ca176:
      __s2 = "google/protobuf/duration.proto";
LAB_002ca186:
      iVar2 = bcmp(__s1,__s2,__n);
    } while (iVar2 == 0);
  }
  return false;
}

Assistant:

bool HasWKTWithObjCCategory(const FileDescriptor* file) {
  // We don't check the name prefix or proto package because some files
  // (descriptor.proto), aren't shipped generated by the library, so this
  // seems to be the safest way to only catch the ones shipped.
  const absl::string_view name = file->name();
  if (name == "google/protobuf/any.proto" ||
      name == "google/protobuf/duration.proto" ||
      name == "google/protobuf/timestamp.proto") {
    ABSL_DCHECK(IsProtobufLibraryBundledProtoFile(file));
    return true;
  }
  return false;
}